

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_PlayerAmmo(FParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  PClassAmmo *type;
  AInventory *pAVar4;
  int iVar5;
  ulong uVar6;
  
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    uVar2 = T_GetPlayerNum(this->t_argv);
    if (uVar2 != 0xffffffff) {
      type = T_GetAmmo(this->t_argv + 1);
      if (type != (PClassAmmo *)0x0) {
        uVar6 = (ulong)uVar2;
        if (2 < this->t_argc) {
          pAVar4 = AActor::FindInventory
                             ((AActor *)(&players)[uVar6 * 0x54],(PClassActor *)type,false);
          iVar3 = intvalue(this->t_argv + 2);
          iVar5 = 0;
          if (0 < iVar3) {
            iVar5 = iVar3;
          }
          if (pAVar4 == (AInventory *)0x0) {
            AActor::GiveAmmo((AActor *)(&players)[uVar6 * 0x54],type,iVar5);
          }
          else {
            pAVar4->Amount = iVar5;
          }
        }
        (this->t_return).type = 1;
        iVar5 = 0;
        pAVar4 = AActor::FindInventory((AActor *)(&players)[uVar6 * 0x54],(PClassActor *)type,false)
        ;
        if (pAVar4 != (AInventory *)0x0) {
          iVar5 = pAVar4->Amount;
        }
        (this->t_return).value.i = iVar5;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_PlayerAmmo(void)
{
	int playernum, amount;
	PClassAmmo * ammotype;
	
	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		ammotype=T_GetAmmo(t_argv[1]);
		if (!ammotype) return;

		if(t_argc >= 3)
		{
			AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
			amount = intvalue(t_argv[2]);
			if(amount < 0) amount = 0;
			if (iammo) iammo->Amount = amount;
			else players[playernum].mo->GiveAmmo(ammotype, amount);
		}

		t_return.type = svt_int;
		AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
		if (iammo) t_return.value.i = iammo->Amount;
		else t_return.value.i = 0;
	}
}